

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase319::run(TestCase319 *this)

{
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  CapTableBuilder *pCVar8;
  void *pvVar9;
  WirePointer *pWVar10;
  undefined2 uVar11;
  unsigned_short uVar12;
  uint uVar13;
  int iVar14;
  PointerType PVar15;
  uint32_t uVar16;
  int iVar17;
  WirePointer WVar18;
  WirePointer WVar19;
  WirePointer WVar20;
  WirePointer WVar21;
  WirePointer WVar22;
  uint uVar23;
  SegmentBuilder *pSVar24;
  CapTableReader *pCVar25;
  WirePointer *pWVar26;
  bool bVar27;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader RVar28;
  Reader group;
  Builder root;
  MallocMessageBuilder builder;
  PointerReader local_1c8;
  uint local_1a8;
  ushort local_1a4;
  int local_1a0;
  undefined1 local_198 [4];
  undefined1 auStack_194 [12];
  WirePointer *local_188;
  WirePointer *pWStack_180;
  StructDataBitCount local_178;
  StructPointerCount SStack_174;
  undefined2 uStack_172;
  SegmentBuilder *local_168;
  StructBuilder local_160;
  PointerBuilder local_138;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_198,&local_120.super_MessageBuilder);
  local_1c8.pointer = local_188;
  local_1c8.segment = &_local_198->super_SegmentReader;
  local_1c8.capTable = (CapTableReader *)auStack_194._4_8_;
  PointerBuilder::initStruct(&local_160,(PointerBuilder *)&local_1c8,(StructSize)0x60006);
  pWVar10 = local_160.pointers;
  pvVar9 = local_160.data;
  pCVar8 = local_160.capTable;
  pSVar24 = local_160.segment;
  ((WireValue<uint32_t> *)local_160.data)->value = 0xbc614e;
  ((WirePointer *)((long)local_160.data + 8))->offsetAndKind = 0x860ddf79;
  ((WirePointer *)((long)local_160.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x7048;
  (((WirePointer *)((long)local_160.data + 0x18))->field_1).structRef.dataSize.value = 1;
  *(undefined2 *)&(((WirePointer *)((long)local_160.data + 0x18))->offsetAndKind).value = 0;
  ((WirePointer *)((long)local_160.data + 0x20))->offsetAndKind = 0;
  ((WirePointer *)((long)local_160.data + 0x20))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  pWVar1 = local_160.pointers + 2;
  local_1c8.segment = &(local_160.segment)->super_SegmentReader;
  local_1c8.capTable = &(local_160.capTable)->super_CapTableReader;
  local_1c8.pointer = pWVar1;
  PointerBuilder::clear((PointerBuilder *)&local_1c8);
  pWVar26 = pWVar10 + 4;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  local_1c8.pointer = pWVar26;
  PointerBuilder::clear((PointerBuilder *)&local_1c8);
  pWVar2 = (WirePointer *)((long)pvVar9 + 0x20);
  pWVar2->offsetAndKind = 0x30f8500d;
  pWVar2->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x38244;
  *(undefined2 *)&(((WirePointer *)((long)pvVar9 + 0x18))->offsetAndKind).value = 0x3039;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  RVar28.super_StringPtr.content.size_ = 6;
  RVar28.super_StringPtr.content.ptr = "plugh";
  local_1c8.pointer = pWVar1;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,RVar28);
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  value.super_StringPtr.content.size_ = 6;
  value.super_StringPtr.content.ptr = "xyzzy";
  local_1c8.pointer = pWVar26;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,value);
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  local_1c8.pointer = pWVar10;
  value_00.super_StringPtr.content.size_ = 6;
  value_00.super_StringPtr.content.ptr = anon_var_dwarf_8676b;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,value_00);
  pWVar10 = local_160.pointers;
  pvVar9 = local_160.data;
  pCVar8 = local_160.capTable;
  pSVar24 = local_160.segment;
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_160.data + 4))->upper32Bits = 0x165ec15
  ;
  ((WirePointer *)((long)local_160.data + 0x10))->offsetAndKind = 0x97c43ac0;
  ((WirePointer *)((long)local_160.data + 0x10))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0xd556;
  (((WirePointer *)((long)local_160.data + 0x18))->field_1).structRef.ptrCount.value = 1;
  *(undefined2 *)((long)&(((WirePointer *)((long)local_160.data + 0x18))->offsetAndKind).value + 2)
       = 0;
  ((WirePointer *)((long)local_160.data + 0x28))->offsetAndKind = 0;
  ((WirePointer *)((long)local_160.data + 0x28))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  pWVar1 = local_160.pointers + 3;
  local_1c8.segment = &(local_160.segment)->super_SegmentReader;
  local_1c8.capTable = &(local_160.capTable)->super_CapTableReader;
  local_1c8.pointer = pWVar1;
  PointerBuilder::clear((PointerBuilder *)&local_1c8);
  pWVar26 = pWVar10 + 5;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  local_1c8.pointer = pWVar26;
  PointerBuilder::clear((PointerBuilder *)&local_1c8);
  pWVar2 = (WirePointer *)((long)pvVar9 + 0x28);
  pWVar2->offsetAndKind = 0x1eb8a086;
  pWVar2->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x31d36;
  *(undefined2 *)((long)&(((WirePointer *)((long)pvVar9 + 0x18))->offsetAndKind).value + 2) = 0x5ba0
  ;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  value_01.super_StringPtr.content.size_ = 6;
  value_01.super_StringPtr.content.ptr = "hgulp";
  local_1c8.pointer = pWVar1;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,value_01);
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  value_02.super_StringPtr.content.size_ = 6;
  value_02.super_StringPtr.content.ptr = "yzzyx";
  local_1c8.pointer = pWVar26;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,value_02);
  local_1c8.pointer = pWVar10 + 1;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.capTable = &pCVar8->super_CapTableReader;
  value_03.super_StringPtr.content.size_ = 6;
  value_03.super_StringPtr.content.ptr = "odlaw";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,value_03);
  StructBuilder::asReader(&local_160);
  iVar17 = local_1a0;
  uVar7 = local_1a4;
  uVar23 = local_1a8;
  pWVar1 = local_1c8.pointer;
  pCVar25 = local_1c8.capTable;
  bVar27 = true;
  if (0x1f < local_1a8) {
    bVar27 = ((local_1c8.pointer)->offsetAndKind).value != 0xbc614e;
  }
  local_168 = (SegmentBuilder *)local_1c8.segment;
  pWVar26 = (WirePointer *)CONCAT44(local_1c8._28_4_,local_1c8.nestingLimit);
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    uVar13 = 0;
    local_1c8.segment = (SegmentReader *)CONCAT44(local_1c8.segment._4_4_,0xbc614e);
    if (0x1f < local_1a8) {
      uVar13 = ((local_1c8.pointer)->offsetAndKind).value;
    }
    local_198 = (undefined1  [4])uVar13;
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(12345678u) == (group.getFoo())\", 12345678u, group.getFoo()"
               ,(char (*) [49])"failed: expected (12345678u) == (group.getFoo())",(uint *)&local_1c8
               ,(uint *)local_198);
  }
  bVar27 = true;
  if (0x7f < uVar23) {
    bVar27 = pWVar1[1] != (WirePointer)0x7048860ddf79;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)0x7048860ddf79;
    if (uVar23 < 0x80) {
      WVar18.offsetAndKind.value = 0;
      WVar18.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar18 = pWVar1[1];
    }
    _local_198 = (SegmentBuilder *)WVar18;
    kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(123456789012345llu) == (group.getBar())\", 123456789012345llu, group.getBar()"
               ,(char (*) [58])"failed: expected (123456789012345llu) == (group.getBar())",
               (unsigned_long_long *)&local_1c8,(unsigned_long *)local_198);
  }
  bVar27 = true;
  if (0x13f < uVar23) {
    bVar27 = pWVar1[4] != (WirePointer)0x3824430f8500d;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)0x3824430f8500d;
    if (uVar23 < 0x140) {
      WVar19.offsetAndKind.value = 0;
      WVar19.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar19 = pWVar1[4];
    }
    _local_198 = (SegmentBuilder *)WVar19;
    kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x162,ERROR,
               "\"failed: expected \" \"(987654321098765llu) == (corge.getGrault())\", 987654321098765llu, corge.getGrault()"
               ,(char (*) [61])"failed: expected (987654321098765llu) == (corge.getGrault())",
               (unsigned_long_long *)&local_1c8,(unsigned_long *)local_198);
  }
  bVar27 = true;
  if (0xcf < uVar23) {
    bVar27 = (short)pWVar1[3].offsetAndKind.value != 0x3039;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)CONCAT44(local_1c8.segment._4_4_,0x3039);
    if (uVar23 < 0xd0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (undefined2)pWVar1[3].offsetAndKind.value;
    }
    local_198._0_2_ = uVar11;
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"(12345u) == (corge.getGarply())\", 12345u, corge.getGarply()"
               ,(char (*) [49])"failed: expected (12345u) == (corge.getGarply())",(uint *)&local_1c8
               ,(unsigned_short *)local_198);
  }
  pSVar24 = local_168;
  if (uVar7 < 3) {
    local_1c8.nestingLimit = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = pWVar26 + 2;
    local_1c8.capTable = pCVar25;
    local_1c8.segment = &local_168->super_SegmentReader;
    local_1c8.nestingLimit = iVar17;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar14 = bcmp(RVar28.super_StringPtr.content.ptr,"plugh",5), iVar14 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (uVar7 < 3) {
      local_1c8.capTable = (CapTableReader *)0x0;
      local_1c8.nestingLimit = 0x7fffffff;
      local_1c8.pointer = (WirePointer *)0x0;
      local_1c8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1c8.pointer = pWVar26 + 2;
      local_1c8.capTable = pCVar25;
      local_1c8.segment = &pSVar24->super_SegmentReader;
      local_1c8.nestingLimit = iVar17;
    }
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"plugh\\\") == (corge.getPlugh())\", \"plugh\", corge.getPlugh()"
               ,(char (*) [49])"failed: expected (\"plugh\") == (corge.getPlugh())",
               (char (*) [6])"plugh",(Reader *)local_198);
  }
  if (uVar7 < 5) {
    local_1c8.nestingLimit = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = pWVar26 + 4;
    local_1c8.capTable = pCVar25;
    local_1c8.segment = &pSVar24->super_SegmentReader;
    local_1c8.nestingLimit = iVar17;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar14 = bcmp(RVar28.super_StringPtr.content.ptr,"xyzzy",5), iVar14 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (uVar7 < 5) {
      local_1c8.capTable = (CapTableReader *)0x0;
      local_1c8.nestingLimit = 0x7fffffff;
      local_1c8.pointer = (WirePointer *)0x0;
      local_1c8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1c8.pointer = pWVar26 + 4;
      local_1c8.capTable = pCVar25;
      local_1c8.segment = &pSVar24->super_SegmentReader;
      local_1c8.nestingLimit = iVar17;
    }
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (corge.getXyzzy())\", \"xyzzy\", corge.getXyzzy()"
               ,(char (*) [49])"failed: expected (\"xyzzy\") == (corge.getXyzzy())",
               (char (*) [6])"xyzzy",(Reader *)local_198);
  }
  local_1c8.capTable = pCVar25;
  local_1c8.pointer = pWVar26;
  local_1c8.segment = &pSVar24->super_SegmentReader;
  local_1c8.nestingLimit = iVar17;
  if (uVar7 == 0) {
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
    local_1c8.nestingLimit = 0x7fffffff;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar14 = bcmp(RVar28.super_StringPtr.content.ptr,anon_var_dwarf_8676b,5), iVar14 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (uVar7 == 0) {
      pCVar25 = (CapTableReader *)0x0;
      iVar17 = 0x7fffffff;
      pWVar26 = (WirePointer *)0x0;
      pSVar24 = (SegmentBuilder *)0x0;
    }
    local_1c8.segment = &pSVar24->super_SegmentReader;
    local_1c8.capTable = pCVar25;
    local_1c8.pointer = pWVar26;
    local_1c8.nestingLimit = iVar17;
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"(\\\"waldo\\\") == (group.getWaldo())\", \"waldo\", group.getWaldo()"
               ,(char (*) [49])"failed: expected (\"waldo\") == (group.getWaldo())",
               &anon_var_dwarf_8676b,(Reader *)local_198);
  }
  ((WireValue<uint32_t> *)local_160.data)->value = 0;
  ((WirePointer *)((long)local_160.data + 8))->offsetAndKind = 0;
  ((WirePointer *)((long)local_160.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  *(undefined2 *)&(((WirePointer *)((long)local_160.data + 0x18))->offsetAndKind).value = 0;
  (((WirePointer *)((long)local_160.data + 0x18))->field_1).structRef.dataSize.value = 0;
  ((WirePointer *)((long)local_160.data + 0x20))->offsetAndKind = 0;
  ((WirePointer *)((long)local_160.data + 0x20))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  local_138.segment = local_160.segment;
  local_138.capTable = local_160.capTable;
  local_138.pointer = local_160.pointers;
  PointerBuilder::clear(&local_138);
  local_138.pointer = local_160.pointers + 2;
  local_138.segment = local_160.segment;
  local_138.capTable = local_160.capTable;
  PointerBuilder::clear(&local_138);
  local_138.pointer = local_160.pointers + 4;
  local_138.segment = local_160.segment;
  local_138.capTable = local_160.capTable;
  PointerBuilder::clear(&local_138);
  auStack_194._4_8_ = local_160.capTable;
  _local_198 = local_160.segment;
  local_188 = (WirePointer *)local_160.data;
  pWStack_180 = local_160.pointers;
  local_178 = local_160.dataSize;
  SStack_174 = local_160.pointerCount;
  uStack_172 = local_160._38_2_;
  StructBuilder::asReader((StructBuilder *)local_198);
  if (local_1a8 < 0x20) {
    bVar27 = false;
  }
  else {
    bVar27 = ((local_1c8.pointer)->offsetAndKind).value != 0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    uVar23 = 0;
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_194;
    _local_198 = (ArrayPtr<const_char>)(auVar4 << 0x20);
    if (0x1f < local_1a8) {
      uVar23 = ((local_1c8.pointer)->offsetAndKind).value;
    }
    local_138.segment = (SegmentBuilder *)CONCAT44(local_138.segment._4_4_,uVar23);
    kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x16c,ERROR,"\"failed: expected \" \"(0u) == (group.getFoo())\", 0u, group.getFoo()"
               ,(char (*) [42])"failed: expected (0u) == (group.getFoo())",(uint *)local_198,
               (uint *)&local_138);
  }
  if (local_1a8 < 0x80) {
    bVar27 = false;
  }
  else {
    bVar27 = local_1c8.pointer[1] != (WirePointer)0x0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_138.segment = (SegmentBuilder *)((ulong)local_138.segment & 0xffffffff00000000);
    if (local_1a8 < 0x80) {
      WVar20.offsetAndKind.value = 0;
      WVar20.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar20 = local_1c8.pointer[1];
    }
    _local_198 = (SegmentBuilder *)WVar20;
    kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x16d,ERROR,"\"failed: expected \" \"(0u) == (group.getBar())\", 0u, group.getBar()"
               ,(char (*) [42])"failed: expected (0u) == (group.getBar())",(uint *)&local_138,
               (unsigned_long *)local_198);
  }
  if (local_1a8 < 0xf0) {
    bVar27 = false;
  }
  else {
    bVar27 = local_1c8.pointer[3].field_1.structRef.dataSize.value != 0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    auVar5._14_2_ = 0;
    auVar5._0_14_ = stack0xfffffffffffffe6a;
    _local_198 = (ArrayPtr<const_char>)(auVar5 << 0x10);
    if (local_1a8 < 0xf0) {
      uVar12 = 0;
    }
    else {
      uVar12 = local_1c8.pointer[3].field_1.structRef.dataSize.value;
    }
    local_138.segment = (SegmentBuilder *)CONCAT62(local_138.segment._2_6_,uVar12);
    kj::_::Debug::
    log<char_const(&)[79],capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which,capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(test::TestInterleavedGroups::Group1::QUX) == (group.which())\", test::TestInterleavedGroups::Group1::QUX, group.which()"
               ,(char (*) [79])
                "failed: expected (test::TestInterleavedGroups::Group1::QUX) == (group.which())",
               (Which *)local_198,(Which *)&local_138);
  }
  if (local_1a8 < 0xd0) {
    bVar27 = false;
  }
  else {
    bVar27 = (short)local_1c8.pointer[3].offsetAndKind.value != 0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_194;
    _local_198 = (ArrayPtr<const_char>)(auVar6 << 0x20);
    if (local_1a8 < 0xd0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (undefined2)local_1c8.pointer[3].offsetAndKind.value;
    }
    local_138.segment = (SegmentBuilder *)CONCAT62(local_138.segment._2_6_,uVar11);
    kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x16f,ERROR,"\"failed: expected \" \"(0u) == (group.getQux())\", 0u, group.getQux()"
               ,(char (*) [42])"failed: expected (0u) == (group.getQux())",(uint *)local_198,
               (unsigned_short *)&local_138);
  }
  if (local_1a4 == 0) {
    _local_198 = (ArrayPtr<const_char>)ZEXT816(0);
    local_188 = (WirePointer *)0x0;
    pWStack_180 = (WirePointer *)CONCAT44(pWStack_180._4_4_,0x7fffffff);
  }
  else {
    local_188 = (WirePointer *)CONCAT44(local_1c8._28_4_,local_1c8.nestingLimit);
    auStack_194._4_8_ = local_1c8.capTable;
    _local_198 = (SegmentBuilder *)local_1c8.segment;
    pWStack_180 = (WirePointer *)CONCAT44(pWStack_180._4_4_,local_1a0);
  }
  PVar15 = PointerReader::getPointerType((PointerReader *)local_198);
  if ((PVar15 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x170,ERROR,"\"failed: expected \" \"!(group.hasWaldo())\"",
               (char (*) [37])"failed: expected !(group.hasWaldo())");
  }
  StructBuilder::asReader(&local_160);
  pWVar1 = local_1c8.pointer;
  pCVar25 = local_1c8.capTable;
  bVar27 = true;
  if (0x3f < local_1a8) {
    bVar27 = ((local_1c8.pointer)->field_1).upper32Bits != 0x165ec15;
  }
  local_168 = (SegmentBuilder *)local_1c8.segment;
  lVar3 = CONCAT44(local_1c8._28_4_,local_1c8.nestingLimit);
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    uVar16 = 0;
    local_1c8.segment = (SegmentReader *)CONCAT44(local_1c8.segment._4_4_,0x165ec15);
    if (0x3f < local_1a8) {
      uVar16 = ((local_1c8.pointer)->field_1).upper32Bits;
    }
    local_198 = (undefined1  [4])uVar16;
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x176,ERROR,
               "\"failed: expected \" \"(23456789u) == (group.getFoo())\", 23456789u, group.getFoo()"
               ,(char (*) [49])"failed: expected (23456789u) == (group.getFoo())",(uint *)&local_1c8
               ,(uint *)local_198);
  }
  bVar27 = true;
  if (0xbf < local_1a8) {
    bVar27 = pWVar1[2] != (WirePointer)0xd55697c43ac0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)0xd55697c43ac0;
    if (local_1a8 < 0xc0) {
      WVar21.offsetAndKind.value = 0;
      WVar21.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar21 = pWVar1[2];
    }
    _local_198 = (SegmentBuilder *)WVar21;
    kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x177,ERROR,
               "\"failed: expected \" \"(234567890123456llu) == (group.getBar())\", 234567890123456llu, group.getBar()"
               ,(char (*) [58])"failed: expected (234567890123456llu) == (group.getBar())",
               (unsigned_long_long *)&local_1c8,(unsigned_long *)local_198);
  }
  bVar27 = true;
  if (0x17f < local_1a8) {
    bVar27 = pWVar1[5] != (WirePointer)0x31d361eb8a086;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)0x31d361eb8a086;
    if (local_1a8 < 0x180) {
      WVar22.offsetAndKind.value = 0;
      WVar22.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar22 = pWVar1[5];
    }
    _local_198 = (SegmentBuilder *)WVar22;
    kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x179,ERROR,
               "\"failed: expected \" \"(876543210987654llu) == (corge.getGrault())\", 876543210987654llu, corge.getGrault()"
               ,(char (*) [61])"failed: expected (876543210987654llu) == (corge.getGrault())",
               (unsigned_long_long *)&local_1c8,(unsigned_long *)local_198);
  }
  bVar27 = true;
  if (0xdf < local_1a8) {
    bVar27 = *(short *)((long)&pWVar1[3].offsetAndKind.value + 2) != 0x5ba0;
  }
  if ((bVar27) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentReader *)CONCAT44(local_1c8.segment._4_4_,0x5ba0);
    if (local_1a8 < 0xe0) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(undefined2 *)((long)&pWVar1[3].offsetAndKind.value + 2);
    }
    local_198._0_2_ = uVar11;
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17a,ERROR,
               "\"failed: expected \" \"(23456u) == (corge.getGarply())\", 23456u, corge.getGarply()"
               ,(char (*) [49])"failed: expected (23456u) == (corge.getGarply())",(uint *)&local_1c8
               ,(unsigned_short *)local_198);
  }
  pSVar24 = local_168;
  if (local_1a4 < 4) {
    local_1c8.nestingLimit = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = (WirePointer *)(lVar3 + 0x18);
    local_1c8.capTable = pCVar25;
    local_1c8.segment = &local_168->super_SegmentReader;
    local_1c8.nestingLimit = local_1a0;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar17 = bcmp(RVar28.super_StringPtr.content.ptr,"hgulp",5), iVar17 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (local_1a4 < 4) {
      local_1c8.capTable = (CapTableReader *)0x0;
      local_1c8.nestingLimit = 0x7fffffff;
      local_1c8.pointer = (WirePointer *)0x0;
      local_1c8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1c8.pointer = (WirePointer *)(lVar3 + 0x18);
      local_1c8.capTable = pCVar25;
      local_1c8.segment = &pSVar24->super_SegmentReader;
      local_1c8.nestingLimit = local_1a0;
    }
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17b,ERROR,
               "\"failed: expected \" \"(\\\"hgulp\\\") == (corge.getPlugh())\", \"hgulp\", corge.getPlugh()"
               ,(char (*) [49])"failed: expected (\"hgulp\") == (corge.getPlugh())",
               (char (*) [6])"hgulp",(Reader *)local_198);
  }
  if (local_1a4 < 6) {
    local_1c8.nestingLimit = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = (WirePointer *)(lVar3 + 0x28);
    local_1c8.capTable = pCVar25;
    local_1c8.segment = &pSVar24->super_SegmentReader;
    local_1c8.nestingLimit = local_1a0;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar17 = bcmp(RVar28.super_StringPtr.content.ptr,"yzzyx",5), iVar17 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (local_1a4 < 6) {
      local_1c8.capTable = (CapTableReader *)0x0;
      local_1c8.nestingLimit = 0x7fffffff;
      local_1c8.pointer = (WirePointer *)0x0;
      local_1c8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1c8.pointer = (WirePointer *)(lVar3 + 0x28);
      local_1c8.capTable = pCVar25;
      local_1c8.segment = &pSVar24->super_SegmentReader;
      local_1c8.nestingLimit = local_1a0;
    }
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(\\\"yzzyx\\\") == (corge.getXyzzy())\", \"yzzyx\", corge.getXyzzy()"
               ,(char (*) [49])"failed: expected (\"yzzyx\") == (corge.getXyzzy())",
               (char (*) [6])"yzzyx",(Reader *)local_198);
  }
  if (local_1a4 < 2) {
    local_1c8.nestingLimit = 0x7fffffff;
    local_1c8.capTable = (CapTableReader *)0x0;
    local_1c8.pointer = (WirePointer *)0x0;
    local_1c8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1c8.pointer = (WirePointer *)(lVar3 + 8);
    local_1c8.capTable = pCVar25;
    local_1c8.segment = &pSVar24->super_SegmentReader;
    local_1c8.nestingLimit = local_1a0;
  }
  RVar28 = PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
  if (((RVar28.super_StringPtr.content.size_ != 6) ||
      (iVar17 = bcmp(RVar28.super_StringPtr.content.ptr,"odlaw",5), iVar17 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    if (local_1a4 < 2) {
      pCVar25 = (CapTableReader *)0x0;
      local_1a0 = 0x7fffffff;
      local_1c8.pointer = (WirePointer *)0x0;
      pSVar24 = (SegmentBuilder *)0x0;
    }
    else {
      local_1c8.pointer = (WirePointer *)(lVar3 + 8);
    }
    local_1c8.segment = &pSVar24->super_SegmentReader;
    local_1c8.capTable = pCVar25;
    local_1c8.nestingLimit = local_1a0;
    _local_198 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0)
    ;
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17d,ERROR,
               "\"failed: expected \" \"(\\\"odlaw\\\") == (group.getWaldo())\", \"odlaw\", group.getWaldo()"
               ,(char (*) [49])"failed: expected (\"odlaw\") == (group.getWaldo())",
               (char (*) [6])"odlaw",(Reader *)local_198);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Encoding, InterleavedGroups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestInterleavedGroups>();

  // Init both groups to different values.
  {
    auto group = root.getGroup1();
    group.setFoo(12345678u);
    group.setBar(123456789012345llu);
    auto corge = group.initCorge();
    corge.setGrault(987654321098765llu);
    corge.setGarply(12345u);
    corge.setPlugh("plugh");
    corge.setXyzzy("xyzzy");
    group.setWaldo("waldo");
  }

  {
    auto group = root.getGroup2();
    group.setFoo(23456789u);
    group.setBar(234567890123456llu);
    auto corge = group.initCorge();
    corge.setGrault(876543210987654llu);
    corge.setGarply(23456u);
    corge.setPlugh("hgulp");
    corge.setXyzzy("yzzyx");
    group.setWaldo("odlaw");
  }

  // Check group1 is still set correctly.
  {
    auto group = root.asReader().getGroup1();
    EXPECT_EQ(12345678u, group.getFoo());
    EXPECT_EQ(123456789012345llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(987654321098765llu, corge.getGrault());
    EXPECT_EQ(12345u, corge.getGarply());
    EXPECT_EQ("plugh", corge.getPlugh());
    EXPECT_EQ("xyzzy", corge.getXyzzy());
    EXPECT_EQ("waldo", group.getWaldo());
  }

  // Zero out group 1 and see if it is zero'd.
  {
    auto group = root.initGroup1().asReader();
    EXPECT_EQ(0u, group.getFoo());
    EXPECT_EQ(0u, group.getBar());
    EXPECT_EQ(test::TestInterleavedGroups::Group1::QUX, group.which());
    EXPECT_EQ(0u, group.getQux());
    EXPECT_FALSE(group.hasWaldo());
  }

  // Group 2 should not have been touched.
  {
    auto group = root.asReader().getGroup2();
    EXPECT_EQ(23456789u, group.getFoo());
    EXPECT_EQ(234567890123456llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(876543210987654llu, corge.getGrault());
    EXPECT_EQ(23456u, corge.getGarply());
    EXPECT_EQ("hgulp", corge.getPlugh());
    EXPECT_EQ("yzzyx", corge.getXyzzy());
    EXPECT_EQ("odlaw", group.getWaldo());
  }
}